

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

Diagnostics * __thiscall slang::ast::Compilation::getParseDiagnostics(Compilation *this)

{
  optional<slang::Diagnostics> *this_00;
  pointer psVar1;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar2;
  
  this_00 = &this->cachedParseDiagnostics;
  if ((this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
      _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
      super__Optional_payload_base<slang::Diagnostics>._M_engaged == false) {
    std::optional<slang::Diagnostics>::emplace<>(this_00);
    psVar1 = (this->syntaxTrees).
             super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar2 = (this->syntaxTrees).
                  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1)
    {
      SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
                ((SmallVectorBase<slang::Diagnostic> *)this_00,
                 &((psVar2->
                   super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->diagnosticsBuffer);
    }
    if (this->sourceManager != (SourceManager *)0x0) {
      Diagnostics::sort((Diagnostics *)this_00,this->sourceManager);
    }
  }
  return (Diagnostics *)this_00;
}

Assistant:

const Diagnostics& Compilation::getParseDiagnostics() {
    if (cachedParseDiagnostics)
        return *cachedParseDiagnostics;

    SLANG_ASSERT(!isFrozen());

    cachedParseDiagnostics.emplace();
    for (auto& tree : syntaxTrees)
        cachedParseDiagnostics->append_range(tree->diagnostics());

    if (sourceManager)
        cachedParseDiagnostics->sort(*sourceManager);
    return *cachedParseDiagnostics;
}